

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

shared_ptr<polyscope::render::TextureBuffer> __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::generateTextureBuffer
          (GLEngine *this,TextureFormat format,uint sizeX_,uint sizeY_,float *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  GLTextureBuffer *in_RDI;
  shared_ptr<polyscope::render::TextureBuffer> sVar1;
  uint unaff_retaddr;
  uint in_stack_00000008;
  TextureFormat in_stack_0000000c;
  GLTextureBuffer *in_stack_00000010;
  GLTextureBuffer *newT;
  GLTextureBuffer *this_00;
  GLTextureBuffer *data_00;
  
  this_00 = in_RDI;
  data_00 = in_RDI;
  operator_new(0x30);
  GLTextureBuffer::GLTextureBuffer
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr,(float *)data_00);
  std::shared_ptr<polyscope::render::TextureBuffer>::
  shared_ptr<polyscope::render::backend_openGL3_glfw::GLTextureBuffer,void>
            ((shared_ptr<polyscope::render::TextureBuffer> *)this_00,in_RDI);
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this_00->super_TextureBuffer;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextureBuffer> GLEngine::generateTextureBuffer(TextureFormat format, unsigned int sizeX_,
                                                               unsigned int sizeY_, const float* data) {
  GLTextureBuffer* newT = new GLTextureBuffer(format, sizeX_, sizeY_, data);
  return std::shared_ptr<TextureBuffer>(newT);
}